

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

AppendResult __thiscall
metaf::WindGroup::appendPeakWind(WindGroup *this,string *group,ReportMetadata *reportMetadata)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  Direction *pDVar5;
  Speed *pSVar6;
  ulong uVar7;
  unsigned_long uVar8;
  MetafTime *pMVar9;
  undefined4 *in_RDI;
  optional<metaf::Direction> oVar10;
  uint minute;
  uint hour;
  optional<metaf::Speed> speed;
  optional<metaf::Direction> dir;
  smatch match;
  uint in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe64;
  undefined1 in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  byte bVar11;
  undefined8 in_stack_fffffffffffffe68;
  Unit unit;
  string *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe80;
  string local_150 [32];
  undefined4 local_130;
  byte local_129;
  string local_128 [32];
  string local_108 [32];
  uint local_e8;
  byte local_e1;
  string local_e0 [32];
  string local_c0 [32];
  _Optional_payload_base<metaf::Speed> local_a0;
  _Storage<metaf::Direction,_true> local_90;
  undefined4 local_88;
  string local_80 [32];
  _Storage<metaf::Direction,_true> local_60;
  undefined4 local_58;
  undefined4 local_54;
  AppendResult local_4;
  
  unit = (Unit)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  if ((appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::pkWndRgx_abi_cxx11_
       == '\0') &&
     (iVar2 = __cxa_guard_acquire(&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)
                                   ::pkWndRgx_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_fffffffffffffe80,
               (char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
               (flag_type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                  pkWndRgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                         pkWndRgx_abi_cxx11_);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe67,
                              CONCAT16(in_stack_fffffffffffffe66,
                                       CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                                      )),in_stack_fffffffffffffe58,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     (match_flag_type)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  if (bVar1) {
    *in_RDI = 8;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(in_stack_fffffffffffffe48,CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    oVar10 = Direction::fromDegreesString
                       ((string *)
                        CONCAT17(in_stack_fffffffffffffe67,
                                 CONCAT16(in_stack_fffffffffffffe66,
                                          CONCAT24(in_stack_fffffffffffffe64,
                                                   in_stack_fffffffffffffe60))));
    local_90 = oVar10.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::Direction>._M_payload;
    local_88 = CONCAT31(local_88._1_3_,
                        oVar10.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
                        super__Optional_payload_base<metaf::Direction>._M_engaged);
    local_58 = local_88;
    local_60 = local_90;
    std::__cxx11::string::~string(local_80);
    bVar1 = std::optional<metaf::Direction>::has_value((optional<metaf::Direction> *)0x241dfb);
    if (bVar1) {
      pDVar5 = std::optional<metaf::Direction>::operator*((optional<metaf::Direction> *)0x241e4d);
      *(Direction *)(in_RDI + 1) = *pDVar5;
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(in_stack_fffffffffffffe48,CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))
      ;
      local_a0 = (_Optional_payload_base<metaf::Speed>)
                 Speed::fromString(in_stack_fffffffffffffe70,unit);
      std::__cxx11::string::~string(local_c0);
      bVar1 = std::optional<metaf::Speed>::has_value((optional<metaf::Speed> *)0x241ec7);
      if (bVar1) {
        pSVar6 = std::optional<metaf::Speed>::operator*((optional<metaf::Speed> *)0x241f19);
        *(_Optional_payload_base<unsigned_int> *)(in_RDI + 3) =
             (pSVar6->speedValue).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
        in_RDI[5] = pSVar6->speedUnit;
        bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x241f3f);
        local_e1 = 0;
        bVar11 = 0;
        if (!bVar1) {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(in_stack_fffffffffffffe48,
                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
          local_e1 = 1;
          bVar11 = std::__cxx11::string::empty();
        }
        if ((local_e1 & 1) != 0) {
          std::__cxx11::string::~string(local_e0);
        }
        if ((bVar11 & 1) == 0) {
          local_129 = 0;
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(in_stack_fffffffffffffe48,
                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::str(in_stack_fffffffffffffe48,
                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
            local_129 = 1;
            uVar8 = std::__cxx11::stoul((string *)
                                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                                                ),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38
                                                ),0);
            uVar3 = (uint)uVar8;
          }
          else {
            pMVar9 = std::optional<metaf::MetafTime>::operator->
                               ((optional<metaf::MetafTime> *)0x242017);
            uVar3 = MetafTime::hour(pMVar9);
          }
          if ((local_129 & 1) != 0) {
            std::__cxx11::string::~string(local_128);
          }
          std::__cxx11::string::~string(local_108);
          local_e8 = uVar3;
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(in_stack_fffffffffffffe48,
                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
          pMVar9 = (MetafTime *)
                   std::__cxx11::stoul((string *)
                                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
                                       ,(size_t *)
                                        CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38
                                                ),0);
          uVar4 = SUB84(pMVar9,0);
          std::__cxx11::string::~string(local_150);
          local_130 = uVar4;
          MetafTime::MetafTime
                    ((MetafTime *)CONCAT44(uVar4,in_stack_fffffffffffffe40),
                     in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          std::optional<metaf::MetafTime>::operator=
                    ((optional<metaf::MetafTime> *)CONCAT44(uVar3,in_stack_fffffffffffffe50),pMVar9)
          ;
          in_RDI[0x19] = 0;
          local_4 = APPENDED;
        }
        else {
          local_4 = GROUP_INVALIDATED;
        }
      }
      else {
        local_4 = GROUP_INVALIDATED;
      }
    }
    else {
      local_4 = GROUP_INVALIDATED;
    }
  }
  else {
    local_4 = GROUP_INVALIDATED;
  }
  local_54 = 1;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x2421cb);
  return local_4;
}

Assistant:

AppendResult WindGroup::appendPeakWind(const std::string & group,
	const ReportMetadata & reportMetadata)
{

	static const std::regex pkWndRgx("(\\d\\d0)([1-9]?\\d\\d)/(\\d\\d)?(\\d\\d)");
	static const auto matchDir = 1, matchSpeed = 2;
	static const auto matchHour = 3, matchMinute = 4;

	std::smatch match;
	if (!std::regex_match(group, match, pkWndRgx)) return AppendResult::GROUP_INVALIDATED;

	windType = Type::PEAK_WIND;
	const auto dir = Direction::fromDegreesString(match.str(matchDir));
	if (!dir.has_value()) return AppendResult::GROUP_INVALIDATED;
	windDir = *dir;

	const auto speed =
		Speed::fromString(match.str(matchSpeed), Speed::Unit::KNOTS);
	if (!speed.has_value()) return AppendResult::GROUP_INVALIDATED;
	wSpeed = *speed;

	if (!reportMetadata.reportTime.has_value() && match.str(matchHour).empty()) {
		return AppendResult::GROUP_INVALIDATED;
	}
	const unsigned int hour = match.str(matchHour).empty() ?
		reportMetadata.reportTime->hour() : (unsigned int)stoul(match.str(matchHour));
	const unsigned int minute = (unsigned int)stoul(match.str(matchMinute));
	evTime = MetafTime(hour, minute);
	incompleteText = IncompleteText::NONE;

	return AppendResult::APPENDED;
}